

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

vector<char,_std::allocator<char>_> * wasm::read_stdin(void)

{
  bool bVar1;
  long *plVar2;
  vector<char,_std::allocator<char>_> *in_RDI;
  byte local_42;
  value_type local_12 [8];
  char c;
  vector<char,_std::allocator<char>_> *input;
  
  bVar1 = isDebugEnabled("file");
  if (bVar1) {
    std::operator<<((ostream *)&std::cerr,"Loading stdin...\n");
  }
  local_12[1] = 0;
  std::vector<char,_std::allocator<char>_>::vector(in_RDI);
  while( true ) {
    plVar2 = (long *)std::istream::get((char *)&std::cin);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    local_42 = 0;
    if (bVar1) {
      local_42 = std::ios::eof();
      local_42 = local_42 ^ 0xff;
    }
    if ((local_42 & 1) == 0) break;
    std::vector<char,_std::allocator<char>_>::push_back(in_RDI,local_12);
  }
  return in_RDI;
}

Assistant:

std::vector<char> wasm::read_stdin() {
  BYN_TRACE("Loading stdin...\n");
  std::vector<char> input;
  char c;
  while (std::cin.get(c) && !std::cin.eof()) {
    input.push_back(c);
  }
  return input;
}